

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void add_block(storage *st,string *data)

{
  undefined8 nblocks;
  bool bVar1;
  char *pcVar2;
  size_t sVar3;
  block local_218;
  undefined1 local_1a8 [8];
  block last;
  uint64_t num;
  string local_128 [32];
  block local_108;
  undefined1 local_88 [8];
  block b;
  string *data_local;
  storage *st_local;
  
  local_88 = (undefined1  [8])0x0;
  b.idx = 0;
  b._104_8_ = data;
  std::__cxx11::string::string((string *)&b.timestamp);
  std::__cxx11::string::string((string *)&b.field_0x28);
  std::__cxx11::string::string((string *)&b.field_0x48);
  bVar1 = storage::empty(st);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_128,"",(allocator *)((long)&num + 7));
    pcVar2 = (char *)std::__cxx11::string::data();
    sVar3 = std::__cxx11::string::size();
    new_block(&local_108,(string *)local_128,0,pcVar2,sVar3);
    block::operator=((block *)local_88,&local_108);
    block::~block(&local_108);
    std::__cxx11::string::~string(local_128);
    std::allocator<char>::~allocator((allocator<char> *)((long)&num + 7));
    storage::add(st,(block *)local_88);
  }
  else {
    last._104_8_ = 0;
    storage::last_block((block *)local_1a8,st,(uint64_t *)&last.field_0x68);
    nblocks = last._104_8_;
    pcVar2 = (char *)std::__cxx11::string::data();
    sVar3 = std::__cxx11::string::size();
    new_block(&local_218,(string *)&last.field_0x48,nblocks,pcVar2,sVar3);
    block::operator=((block *)local_88,&local_218);
    block::~block(&local_218);
    storage::add(st,(block *)local_88);
    block::~block((block *)local_1a8);
  }
  block::~block((block *)local_88);
  return;
}

Assistant:

void add_block(storage &st, const std::string &data) {
    block b{};
    if ( st.empty() ) {
        b = new_block("", 0, data.data(), data.size());
        st.add(b);
    } else {
        std::uint64_t num{};
        block last = st.last_block(&num);
        b = new_block(last.sha256, num, data.data(), data.size());
        st.add(b);
    }
}